

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_search_set_text(XMLSearch *search,SXML_CHAR *text)

{
  char *pcVar1;
  SXML_CHAR *text_local;
  XMLSearch *search_local;
  
  if (search == (XMLSearch *)0x0) {
    search_local._4_4_ = 0;
  }
  else if (text == (SXML_CHAR *)0x0) {
    if (search->text != (SXML_CHAR *)0x0) {
      free(search->text);
      search->text = (SXML_CHAR *)0x0;
    }
    search_local._4_4_ = 1;
  }
  else {
    pcVar1 = strdup(text);
    search->text = pcVar1;
    search_local._4_4_ = (uint)(search->text != (SXML_CHAR *)0x0);
  }
  return search_local._4_4_;
}

Assistant:

int XMLSearch_search_set_text(XMLSearch* search, const SXML_CHAR* text)
{
	if (search == NULL)
		return FALSE;

	if (text == NULL) {
		if (search->text != NULL) {
			__free(search->text);
			search->text = NULL;
		}
		return TRUE;
	}

	search->text = sx_strdup(text);
	return (search->text != NULL);
}